

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3.c
# Opt level: O1

void mp3_calc_hdr(mp3_frame_t *frame)

{
  ushort uVar1;
  unsigned_long uVar2;
  long lVar3;
  ulong uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long *puVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  
  if (frame != (mp3_frame_t *)0x0) {
    bVar8 = frame->mode != '\x03';
    uVar5 = 0x20;
    if (!bVar8) {
      uVar5 = 0x11;
    }
    bVar9 = frame->id == 3;
    puVar7 = lsf_bitratetable;
    if (bVar9) {
      puVar7 = bitratetable;
    }
    uVar2 = puVar7[frame->bitrate_index];
    frame->bitrate = uVar2;
    uVar1 = sampleratetable[frame->id][frame->samplerfindex];
    frame->samplerate = (ulong)uVar1;
    frame->samplelen = 0x480;
    uVar6 = (ulong)bVar8 * 8 + 9;
    if (bVar9) {
      uVar6 = uVar5;
    }
    frame->si_size = uVar6;
    lVar3 = 72000;
    if (bVar9) {
      lVar3 = 0x23280;
    }
    frame->si_bitsize = (ulong)(uint)((int)uVar6 * 8);
    uVar5 = (ulong)frame->padding_bit + (lVar3 * uVar2) / (ulong)uVar1;
    frame->frame_size = uVar5;
    frame->frame_data_size = (uVar5 - uVar6) - 4;
    if (frame->protected == '\0') {
      frame->frame_data_size = (uVar5 - uVar6) - 6;
    }
    auVar10._8_4_ = (int)(uVar5 >> 0x20);
    auVar10._0_8_ = uVar5;
    auVar10._12_4_ = 0x45300000;
    uVar2 = frame->bitrate;
    auVar11._8_4_ = (int)(uVar2 >> 0x20);
    auVar11._0_8_ = uVar2;
    auVar11._12_4_ = 0x45300000;
    dVar12 = (((auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) * 8.0 * 1000.0) /
             ((auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
    uVar4 = (ulong)dVar12;
    frame->usec = (long)(dVar12 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
    return;
  }
  __assert_fail("frame != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3.c",0x31,
                "void mp3_calc_hdr(mp3_frame_t *)");
}

Assistant:

void mp3_calc_hdr(mp3_frame_t *frame) {
  assert(frame != NULL);

  const int is_lsf = frame->id != MPEG_VERSION_1; // MPEG 2 and 2.5 are Lower Sampling Frequency extension

  if (is_lsf) {
    frame->bitrate = lsf_bitratetable[frame->bitrate_index];
  } else {
    frame->bitrate = bitratetable[frame->bitrate_index];

  }
  frame->samplerate = sampleratetable[frame->id][frame->samplerfindex];
  frame->samplelen = 1152; /* only layer III */
  if (is_lsf) {
    frame->si_size = frame->mode != (unsigned char) 3 ? 17 : 9;
  } else {
    frame->si_size = frame->mode != (unsigned char) 3 ? 32 : 17;
  }
  frame->si_bitsize = frame->si_size * 8;

  /* calculate frame length */
  if (is_lsf) {
    frame->frame_size = 72000 * frame->bitrate;
  } else {
    frame->frame_size = 144000 * frame->bitrate;
  }
  frame->frame_size /= frame->samplerate;
  frame->frame_size += frame->padding_bit;

  frame->frame_data_size = frame->frame_size - 4 - frame->si_size;
  if (frame->protected == 0)
    frame->frame_data_size -= 2;

  frame->usec = (double) frame->frame_size * 8 * 1000.0 / ((double) frame->bitrate);
}